

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

size_t __thiscall
CVmObjByteArray::copy_to_buf(CVmObjByteArray *this,uchar *buf,unsigned_long idx,size_t len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar2 = (ulong)*(uint *)(this->super_CVmObject).ext_;
  if (uVar2 < idx) {
    len = 0;
  }
  else if (uVar2 < len + idx) {
    len = (uVar2 - idx) + 1;
  }
  sVar4 = 0;
  for (; len != 0; len = len - uVar2) {
    uVar1 = (uint)(idx - 1);
    uVar3 = (ulong)(uVar1 & 0x7fff);
    uVar2 = 0x8000 - uVar3;
    if (len <= uVar2) {
      uVar2 = len;
    }
    memcpy(buf,(void *)(uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                   (idx - 1 >> 0x1c) * 8 + 4) +
                                         (ulong)(uVar1 >> 0xc & 0xfff8))),uVar2);
    buf = buf + uVar2;
    idx = idx + uVar2;
    sVar4 = sVar4 + uVar2;
  }
  return sVar4;
}

Assistant:

size_t CVmObjByteArray::copy_to_buf(unsigned char *buf,
                                    unsigned long idx, size_t len) const
{
    /* we haven't copied any bytes so far */
    size_t actual = 0;

    /* limit it to the actual available space */
    unsigned long contlen = get_element_count();
    if (idx > contlen)
        len = 0;
    else if (idx + len > contlen)
        len = contlen - idx + 1;

    /* keep going until we satisfy the request */
    while (len != 0)
    {
        size_t avail;
        unsigned char *p;
        size_t copy_len;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* if there's nothing left, stop */
        if (avail == 0)
            break;

        /* copy the available bytes or the reamining desired bytes */
        copy_len = avail;
        if (copy_len > len)
            copy_len = len;

        /* copy the bytes */
        memcpy(buf, p, copy_len);

        /* advance past the copied bytes */
        buf += copy_len;
        idx += copy_len;
        len -= copy_len;
        actual += copy_len;
    }

    /* return the actual size copied */
    return actual;
}